

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,ArrayPtr<const_char> expected)

{
  char *pcVar1;
  ulong uVar2;
  ulong numBytes;
  ulong uVar3;
  bool bVar4;
  Fault f;
  Fault f_1;
  Fault local_20;
  Fault local_18;
  undefined8 uStack_10;
  
  numBytes = expected.size_;
  if ((this->wrapped).size_ < numBytes) {
    local_20.exception = (Exception *)0x0;
    local_18.exception = (Exception *)0x0;
    uStack_10 = 0;
    kj::_::Debug::Fault::init
              (&local_20,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
              );
    kj::_::Debug::Fault::fatal(&local_20);
  }
  bVar4 = numBytes == 0;
  if (!bVar4) {
    pcVar1 = (this->wrapped).ptr;
    if (*pcVar1 != *expected.ptr) goto LAB_00398e25;
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (numBytes == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (pcVar1[uVar3] == expected.ptr[uVar3]);
    bVar4 = numBytes <= uVar3;
  }
  if (bVar4) {
    advance(this,numBytes);
    return;
  }
LAB_00398e25:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x23b,FAILED,"prefix == expected","\"Unexpected input in JSON message.\"",
             (char (*) [34])"Unexpected input in JSON message.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

void consume(kj::ArrayPtr<const char> expected) {
    KJ_REQUIRE(wrapped.size() >= expected.size());

    auto prefix = wrapped.slice(0, expected.size());
    KJ_REQUIRE(prefix == expected, "Unexpected input in JSON message.");

    advance(expected.size());
  }